

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFtpCommand.cpp
# Opt level: O3

int __thiscall CSTORCommand::doWhat(CSTORCommand *this,CClient *pClient)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  EFTPSTATE EVar4;
  int iVar5;
  long *plVar6;
  CPasvDataTransfer *pCVar7;
  CPortDataTransfer *this_00;
  ulong *puVar8;
  string ret;
  string msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string local_90;
  string local_70;
  string local_50;
  
  EVar4 = CClient::GetClientState(pClient);
  paVar1 = &local_70.field_2;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  if (EVar4 == PASV) {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"RECVFILE#","");
    CClient::GetUserDir_abi_cxx11_(&local_90,pClient);
    paVar2 = &local_90.field_2;
    iVar5 = chdir(local_90._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    if (iVar5 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Current user dir is error,now program will exit.",0x30);
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
LAB_0010825c:
      exit(-1);
    }
    CClient::GetUserDir_abi_cxx11_(&local_90,pClient);
    std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_90._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,local_70._M_dataplus._M_p,
               local_70._M_dataplus._M_p + local_70._M_string_length);
    std::__cxx11::string::append((char *)&local_50);
    plVar6 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_50,
                                (ulong)(this->super_CCommand).m_Args._M_dataplus._M_p);
    puVar8 = (ulong *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar8) {
      local_90.field_2._M_allocated_capacity = *puVar8;
      local_90.field_2._8_8_ = plVar6[3];
      local_90._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_90.field_2._M_allocated_capacity = *puVar8;
      local_90._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_90._M_string_length = plVar6[1];
    *plVar6 = (long)puVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_70,(string *)&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    pCVar7 = CClient::SetClientPasvDataTransfer(pClient);
    CPasvDataTransfer::SetMsg(pCVar7,&local_70);
    local_90._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,"150 Ok to send data.\r\n","");
    CClient::sendMsg(pClient,&local_90);
    pCVar7 = CClient::SetClientPasvDataTransfer(pClient);
    CClient::GetClientfd(pClient);
    CPasvDataTransfer::SetControlSock(pCVar7);
    pCVar7 = CClient::SetClientPasvDataTransfer(pClient);
    CPasvDataTransfer::SetControlSock(pCVar7);
    CClient::SetClientState(pClient,PASS);
    CClient::SetClientPasvDataTransfer(pClient);
  }
  else {
    EVar4 = CClient::GetClientState(pClient);
    if (EVar4 != PORT) {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_70,"425 Use PORT or PASV first.\r\n","");
      CClient::sendMsg(pClient,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != paVar1) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      return -1;
    }
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"RECVFILE#","");
    CClient::GetUserDir_abi_cxx11_(&local_90,pClient);
    paVar2 = &local_90.field_2;
    iVar5 = chdir(local_90._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    if (iVar5 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Current user dir is error,now program will exit.",0x30);
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      goto LAB_0010825c;
    }
    CClient::GetUserDir_abi_cxx11_(&local_90,pClient);
    std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_90._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    paVar3 = &local_50.field_2;
    local_50._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,local_70._M_dataplus._M_p,
               local_70._M_dataplus._M_p + local_70._M_string_length);
    std::__cxx11::string::append((char *)&local_50);
    plVar6 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_50,
                                (ulong)(this->super_CCommand).m_Args._M_dataplus._M_p);
    puVar8 = (ulong *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar8) {
      local_90.field_2._M_allocated_capacity = *puVar8;
      local_90.field_2._8_8_ = plVar6[3];
      local_90._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_90.field_2._M_allocated_capacity = *puVar8;
      local_90._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_90._M_string_length = plVar6[1];
    *plVar6 = (long)puVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_70,(string *)&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar3) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    local_90._M_string_length = 0;
    local_90.field_2._M_allocated_capacity =
         local_90.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_90._M_dataplus._M_p = (pointer)paVar2;
    local_50._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"150 Ok to send data.\r\n","");
    CClient::sendMsg(pClient,&local_50);
    iVar5 = CClient::GetClientPortIpAndPort(pClient,&local_90);
    this_00 = (CPortDataTransfer *)operator_new(0x60);
    CPortDataTransfer::CPortDataTransfer(this_00,&local_90,iVar5);
    CPortDataTransfer::SetMsg(this_00,&local_70);
    iVar5 = CClient::GetClientfd(pClient);
    CPortDataTransfer::SetControlSock(this_00,iVar5);
    CThread::Run((CThread *)this_00);
    CClient::SetClientState(pClient,PASS);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar3) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  return 1;
}

Assistant:

int CSTORCommand::doWhat(CClient *pClient){
    if(pClient->GetClientState() == PASV){
        string msg = "RECVFILE#";
        int r = chdir(pClient->GetUserDir().c_str());
        if(r == 0){
            msg += pClient->GetUserDir();
            msg = msg + "#" + m_Args;
            pClient->GetClientPasvDataTransfer()->SetMsg(msg);
            string ret = "150 Ok to send data.\r\n";
            pClient->sendMsg(ret);
            pClient->GetClientPasvDataTransfer()->SetControlSock(pClient->GetClientfd());
            pClient->GetClientPasvDataTransfer()->PostSignal();

            pClient->SetClientState(PASS);
            pClient->SetClientPasvDataTransfer(NULL);
            return 1;
        }
        else{
            cout << "Current user dir is error,now program will exit." << endl;
            exit(-1);
        }
    }
    else if(pClient->GetClientState() == PORT){
        string msg = "RECVFILE#";
        int r = chdir(pClient->GetUserDir().c_str());
        if(r == 0){
            msg += pClient->GetUserDir();
            msg = msg + "#" + m_Args;

            string ip;
            int port;
            string ret = "150 Ok to send data.\r\n";
            pClient->sendMsg(ret);
            port = pClient->GetClientPortIpAndPort(ip);
            CPortDataTransfer *c = new CPortDataTransfer(ip,port);
            c->SetMsg(msg);
            c->SetControlSock(pClient->GetClientfd());
            c->Run();
            pClient->SetClientState(PASS);

            return 1;
        }
        else{
            cout << "Current user dir is error,now program will exit." << endl;
            exit(-1);
        }
    }
    else{
        string ret = "425 Use PORT or PASV first.\r\n";
        pClient->sendMsg(ret);
        return -1;
    }
}